

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingCompressionState<int,_true,_int>::BitpackingWriter::WriteDeltaFor
               (int *values,bool *validity,bitpacking_width_t width,int frame_of_reference,
               int delta_offset,int *original_values,idx_t count,void *data_ptr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  unsigned_long uVar4;
  idx_t iVar5;
  ulong uVar6;
  bitpacking_metadata_encoded_t encoded_value;
  ulong uVar7;
  ulong uVar8;
  uint32_t *in;
  int *piVar9;
  ulong uVar10;
  uint32_t local_b8 [34];
  
  iVar5 = count;
  if ((count & 0x1f) != 0) {
    uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)count & 0x1f);
    iVar5 = (count - uVar4) + 0x20;
  }
  uVar6 = iVar5 * width >> 3;
  FlushAndCreateSegmentIfFull((BitpackingCompressionState<int,_true,_int> *)data_ptr,uVar6 + 0xc,4);
  iVar1 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  lVar3 = *(long *)((long)data_ptr + 0x48);
  iVar2 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  *(long *)((long)data_ptr + 0x48) = lVar3 + -4;
  *(uint *)(lVar3 + -4) = iVar1 - iVar2 | 0x4000000;
  piVar9 = *(int **)((long)data_ptr + 0x40);
  *piVar9 = frame_of_reference;
  *(int **)((long)data_ptr + 0x40) = piVar9 + 1;
  piVar9[1] = (uint)width;
  *(int **)((long)data_ptr + 0x40) = piVar9 + 2;
  piVar9[2] = delta_offset;
  piVar9 = piVar9 + 3;
  *(int **)((long)data_ptr + 0x40) = piVar9;
  uVar10 = count & 0xffffffffffffffe0;
  if (uVar10 != 0) {
    uVar8 = 0;
    uVar7 = 0;
    in = (uint32_t *)values;
    do {
      duckdb_fastpforlib::fastpack(in,(uint32_t *)((uVar8 >> 3) + (long)piVar9),(uint)width);
      uVar7 = uVar7 + 0x20;
      in = in + 0x20;
      uVar8 = uVar8 + (ulong)width * 0x20;
    } while (uVar7 < uVar10);
  }
  if ((count & 0x1f) != 0) {
    uVar7 = (ulong)(((uint)count & 0x1f) << 2);
    switchD_0105b559::default((void *)((long)local_b8 + uVar7),0,0x80 - uVar7);
    switchD_015ff80e::default(local_b8,values + uVar10,uVar7);
    duckdb_fastpforlib::fastpack
              (local_b8,(uint32_t *)((long)piVar9 + (width * uVar10 >> 3)),(uint)width);
  }
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + uVar6;
  UpdateStats((BitpackingCompressionState<int,_true,_int> *)data_ptr,count);
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}